

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_194fe6::BuildFileImpl::nodeIsScalarString
          (BuildFileImpl *this,Node *node,StringRef name)

{
  uint uVar1;
  bool local_f1;
  string local_d8;
  void *local_b8;
  ScalarNode *local_a8;
  Node *node_local;
  BuildFileImpl *this_local;
  StringRef name_local;
  void *local_50;
  char *local_48;
  void **local_40;
  BuildFileImpl *local_38;
  char *local_30;
  char *local_28;
  BuildFileImpl *local_20;
  void *local_18;
  int local_c;
  
  name_local.Data = (char *)name.Length;
  this_local = (BuildFileImpl *)name.Data;
  local_a8 = (ScalarNode *)node;
  node_local = (Node *)this;
  uVar1 = llvm::yaml::Node::getType(node);
  if (uVar1 == 1) {
    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_(&local_d8,this,local_a8);
    local_b8 = (void *)std::__cxx11::string::data();
    local_48 = (char *)std::__cxx11::string::length();
    local_50 = local_b8;
    local_38 = this_local;
    local_30 = name_local.Data;
    local_40 = &local_50;
    local_f1 = false;
    if (local_48 == name_local.Data) {
      local_18 = local_b8;
      local_20 = this_local;
      local_28 = name_local.Data;
      if (name_local.Data == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_b8,this_local,(size_t)name_local.Data);
      }
      local_f1 = local_c == 0;
    }
    name_local.Length._7_1_ = local_f1;
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    name_local.Length._7_1_ = 0;
  }
  return (bool)(name_local.Length._7_1_ & 1);
}

Assistant:

bool nodeIsScalarString(llvm::yaml::Node* node, StringRef name) {
    if (node->getType() != llvm::yaml::Node::NK_Scalar)
      return false;

    return stringFromScalarNode(
        static_cast<llvm::yaml::ScalarNode*>(node)) == name;
  }